

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O2

char * call_type_to_string(uint8_t call_type,char *string_buf,size_t string_buf_len)

{
  char *__string;
  char *__string_00;
  size_t sVar1;
  size_t sVar2;
  undefined7 in_register_00000039;
  
  __string = call_type_str[(uint)CONCAT71(in_register_00000039,call_type) & 0xf];
  sVar1 = strnlen(__string,0x14);
  __string_00 = pmt_type_str[CONCAT71(in_register_00000039,call_type) >> 4 & 0xfffffff];
  sVar2 = strnlen(__string_00,0x11);
  if (string_buf_len < sVar2 + sVar1 + 1) {
    string_buf = (char *)0x0;
  }
  else {
    snprintf(string_buf,string_buf_len,"%s %s",__string,__string_00);
  }
  return string_buf;
}

Assistant:

char* call_type_to_string(uint8_t call_type, char *string_buf, size_t string_buf_len) {
    size_t len_call_type, len_pmt_type;

    len_call_type = strnlen(call_type_str[call_type & 0x0f], 20);
    len_pmt_type  = strnlen(pmt_type_str[call_type >> 4], 17);

    if ((len_call_type + len_pmt_type + 1) > string_buf_len) {
        return NULL;
    }

    snprintf(string_buf, string_buf_len, "%s %s",
             call_type_str[call_type & 0x0f],
             pmt_type_str[call_type >> 4]);

    return string_buf;
}